

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O1

bool absl::lts_20240722::str_format_internal::ConvertIntArg<int>
               (int v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  bool bVar1;
  char *pcVar2;
  FormatSinkImpl *pFVar3;
  uint uVar4;
  undefined4 in_register_0000003c;
  FormatSinkImpl *this;
  FormatSinkImpl *in_R8;
  char *pcVar5;
  FormatConversionSpecImpl conv_00;
  FormatConversionSpecImpl conv_01;
  FormatConversionSpecImpl conv_02;
  string_view v_00;
  undefined8 local_60;
  uint local_58;
  char *local_50;
  size_t local_48;
  char local_40 [42];
  char local_16 [6];
  
  this = (FormatSinkImpl *)CONCAT44(in_register_0000003c,v);
  conv_01.width_ = (undefined4)((ulong)register0x00000010 >> 0x20);
  conv_01._0_4_ = conv.precision_;
  conv_00._0_8_ = conv._0_8_;
  conv_01.precision_ = (int)sink;
  local_60 = conv_00._0_8_;
  local_58 = conv_01._0_4_;
  switch((ulong)conv_00._0_8_ & 0xff) {
  case 0:
    local_60._2_1_ = conv.length_mod_;
    if (local_60._2_1_ != l) {
      conv_00.precision_ = conv_01.precision_;
      anon_unknown_53::ConvertCharImpl
                ((char)v,conv_00,(FormatSinkImpl *)&switchD_00109511::switchdataD_001101c8);
      return true;
    }
    bVar1 = anon_unknown_53::ConvertWCharTImpl((anon_unknown_53 *)this,conv._0_4_,conv_01,in_R8);
    return bVar1;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/internal/str_format/arg.cc"
                  ,0x1c2,
                  "bool absl::str_format_internal::ConvertIntArg(T, FormatConversionSpecImpl, FormatSinkImpl *) [T = int]"
                 );
  case 2:
  case 3:
  case 0x12:
    pcVar5 = local_40;
    local_50 = pcVar5;
    pcVar2 = (char *)absl::lts_20240722::numbers_internal::FastIntToBuffer(v,pcVar5);
    goto LAB_00109612;
  case 4:
    pcVar5 = local_16 + 2;
    pFVar3 = (FormatSinkImpl *)(ulong)(uint)v;
    do {
      uVar4 = (uint)this;
      pcVar5[-1] = (byte)this & 7 | 0x30;
      pcVar5 = pcVar5 + -1;
      pFVar3 = (FormatSinkImpl *)((ulong)pFVar3 >> 3);
      this = pFVar3;
    } while (7 < uVar4);
    break;
  case 5:
    pcVar5 = local_40;
    local_50 = pcVar5;
    pcVar2 = (char *)absl::lts_20240722::numbers_internal::FastIntToBuffer(v,pcVar5);
    goto LAB_00109612;
  case 6:
    pcVar5 = local_16 + 3;
    pFVar3 = (FormatSinkImpl *)(ulong)(uint)v;
    do {
      pcVar2 = pcVar5;
      uVar4 = (uint)this;
      *(undefined2 *)(pcVar2 + -3) =
           *(undefined2 *)((long)&numbers_internal::kHexTable + (ulong)(uVar4 & 0xff) * 2);
      this = (FormatSinkImpl *)((ulong)pFVar3 >> 8);
      pcVar5 = pcVar2 + -2;
      pFVar3 = this;
    } while (0xff < uVar4);
    in_R8 = this;
    pcVar5 = pcVar2 + -3;
    if (pcVar2[-3] == '0') {
      pcVar5 = pcVar2 + -2;
    }
    break;
  case 7:
    pcVar5 = local_16 + 2;
    pFVar3 = (FormatSinkImpl *)(ulong)(uint)v;
    do {
      uVar4 = (uint)this;
      pcVar5[-1] = "0123456789ABCDEF"[uVar4 & 0xf];
      pcVar5 = pcVar5 + -1;
      pFVar3 = (FormatSinkImpl *)((ulong)pFVar3 >> 4);
      this = pFVar3;
    } while (0xf < uVar4);
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    bVar1 = ConvertFloatImpl((double)v,(FormatConversionSpecImpl *)&local_60,sink);
    return bVar1;
  }
  pcVar2 = local_16 + 2;
  local_50 = pcVar5;
LAB_00109612:
  local_48 = (long)pcVar2 - (long)pcVar5;
  if (local_60._1_1_ == kBasic) {
    v_00._M_str = local_50;
    v_00._M_len = local_48;
    FormatSinkImpl::Append(sink,v_00);
  }
  else {
    conv_02.width_ = 0;
    conv_02.conv_ = (undefined1)local_58;
    conv_02.flags_ = local_58._1_1_;
    conv_02.length_mod_ = local_58._2_1_;
    conv_02._3_1_ = local_58._3_1_;
    conv_02.precision_ = conv_01.precision_;
    anon_unknown_53::ConvertIntImplInnerSlow((anon_unknown_53 *)&local_50,local_60,conv_02,in_R8);
  }
  return true;
}

Assistant:

bool ConvertIntArg(T v, FormatConversionSpecImpl conv, FormatSinkImpl *sink) {
  using U = typename MakeUnsigned<T>::type;
  IntDigits as_digits;

  // This odd casting is due to a bug in -Wswitch behavior in gcc49 which causes
  // it to complain about a switch/case type mismatch, even though both are
  // FormatConversionChar.  Likely this is because at this point
  // FormatConversionChar is declared, but not defined.
  switch (static_cast<uint8_t>(conv.conversion_char())) {
    case static_cast<uint8_t>(FormatConversionCharInternal::c):
      return (std::is_same<T, wchar_t>::value ||
              (conv.length_mod() == LengthMod::l))
                 ? ConvertWCharTImpl(static_cast<wchar_t>(v), conv, sink)
                 : ConvertCharImpl(static_cast<char>(v), conv, sink);

    case static_cast<uint8_t>(FormatConversionCharInternal::o):
      as_digits.PrintAsOct(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::x):
      as_digits.PrintAsHexLower(static_cast<U>(v));
      break;
    case static_cast<uint8_t>(FormatConversionCharInternal::X):
      as_digits.PrintAsHexUpper(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::u):
      as_digits.PrintAsDec(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::d):
    case static_cast<uint8_t>(FormatConversionCharInternal::i):
    case static_cast<uint8_t>(FormatConversionCharInternal::v):
      as_digits.PrintAsDec(v);
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::a):
    case static_cast<uint8_t>(FormatConversionCharInternal::e):
    case static_cast<uint8_t>(FormatConversionCharInternal::f):
    case static_cast<uint8_t>(FormatConversionCharInternal::g):
    case static_cast<uint8_t>(FormatConversionCharInternal::A):
    case static_cast<uint8_t>(FormatConversionCharInternal::E):
    case static_cast<uint8_t>(FormatConversionCharInternal::F):
    case static_cast<uint8_t>(FormatConversionCharInternal::G):
      return ConvertFloatImpl(static_cast<double>(v), conv, sink);

    default:
      ABSL_ASSUME(false);
  }

  if (conv.is_basic()) {
    sink->Append(as_digits.with_neg_and_zero());
    return true;
  }
  return ConvertIntImplInnerSlow(as_digits, conv, sink);
}